

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O1

bool SetPropertyCommand::HandleAndValidateTestDirectoryScopes
               (cmExecutionStatus *status,bool test_directory_option_enabled,string *test_directory,
               cmMakefile **test_directory_makefile)

{
  bool bVar1;
  
  bVar1 = HandleTestDirectoryScopeValidation(status,test_directory_option_enabled,test_directory);
  if (bVar1) {
    bVar1 = HandleTestDirectoryScopes(status,test_directory,test_directory_makefile);
    return bVar1;
  }
  return false;
}

Assistant:

bool HandleAndValidateTestDirectoryScopes(cmExecutionStatus& status,
                                          bool test_directory_option_enabled,
                                          std::string& test_directory,
                                          cmMakefile*& test_directory_makefile)
{
  bool scope_options_valid =
    SetPropertyCommand::HandleTestDirectoryScopeValidation(
      status, test_directory_option_enabled, test_directory);
  if (!scope_options_valid) {
    return false;
  }

  scope_options_valid = SetPropertyCommand::HandleTestDirectoryScopes(
    status, test_directory, test_directory_makefile);
  return scope_options_valid;
}